

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::InputLess<tcu::Matrix<float,_2,_4>_>::operator()
          (InputLess<tcu::Matrix<float,_2,_4>_> *this,Matrix<float,_2,_4> *mat1,
          Matrix<float,_2,_4> *mat2)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    uVar3 = uVar2;
    if (uVar2 == 4) goto LAB_0083597e;
    bVar1 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)mat1,(Vector<float,_2> *)mat2);
    if (bVar1) {
      uVar3 = 1;
      goto LAB_0083597e;
    }
    bVar1 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)mat2,(Vector<float,_2> *)mat1);
    mat2 = (Matrix<float,_2,_4> *)((long)mat2 + 8);
    mat1 = (Matrix<float,_2,_4> *)((long)mat1 + 8);
    uVar3 = uVar2 + 1;
  } while (!bVar1);
  uVar3 = 0;
LAB_0083597e:
  return (bool)(uVar2 < 4 & (byte)uVar3);
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}